

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O2

obj * find_oid(level *lev,uint id)

{
  xchar xVar1;
  obj *poVar2;
  long lVar3;
  monst **ppmVar4;
  
  if ((lev != (level *)0x0) && (poVar2 = find_oid_lev(lev,id), poVar2 != (obj *)0x0)) {
    return poVar2;
  }
  poVar2 = o_on(id,invent);
  if (poVar2 != (obj *)0x0) {
    return poVar2;
  }
  poVar2 = o_on(id,magic_chest_objs);
  if (poVar2 != (obj *)0x0) {
    return poVar2;
  }
  ppmVar4 = &migrating_mons;
  do {
    ppmVar4 = &((monst *)ppmVar4)->nmon->nmon;
    if ((monst *)ppmVar4 == (monst *)0x0) {
      ppmVar4 = &mydogs;
      do {
        ppmVar4 = &((monst *)ppmVar4)->nmon->nmon;
        if ((monst *)ppmVar4 == (monst *)0x0) {
          lVar3 = 0;
          while( true ) {
            xVar1 = maxledgerno();
            if (xVar1 < lVar3) {
              return (obj *)0x0;
            }
            if ((levels[lVar3] != (level *)0x0) &&
               (poVar2 = find_oid_lev(levels[lVar3],id), poVar2 != (obj *)0x0)) break;
            lVar3 = lVar3 + 1;
          }
          return poVar2;
        }
        poVar2 = o_on(id,((monst *)ppmVar4)->minvent);
      } while (poVar2 == (obj *)0x0);
      return poVar2;
    }
    poVar2 = o_on(id,((monst *)ppmVar4)->minvent);
  } while (poVar2 == (obj *)0x0);
  return poVar2;
}

Assistant:

struct obj *find_oid(struct level *lev, unsigned id)
{
	struct obj *obj;
	struct monst *mon;
	int i;

	/* try searching the current level, if any */
	if (lev && (obj = find_oid_lev(lev, id))) return obj;

	/* first check various obj lists directly */
	if ((obj = o_on(id, invent))) return obj;
	if ((obj = o_on(id, magic_chest_objs))) return obj;

	/* not found yet; check inventory for members of various monst lists */
	for (mon = migrating_mons; mon; mon = mon->nmon)
	    if ((obj = o_on(id, mon->minvent))) return obj;
	for (mon = mydogs; mon; mon = mon->nmon)
	    if ((obj = o_on(id, mon->minvent))) return obj;

	/* search all levels */
	for (i = 0; i <= maxledgerno(); i++)
	    if (levels[i] && (obj = find_oid_lev(levels[i], id))) return obj;

	/* not found at all */
	return NULL;
}